

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O3

bool __thiscall PClass::ReadValue(PClass *this,FArchive *ar,void *addr)

{
  bool bVar1;
  PClass *pPVar2;
  bool bVar3;
  BYTE tag;
  PClass *type;
  byte local_39;
  PClass *local_38;
  
  FArchive::operator<<(ar,&local_39);
  if (local_39 == 0x12) {
    FArchive::UserReadClass(ar,&local_38);
    bVar3 = false;
    if (local_38 != (PClass *)0x0) {
      bVar3 = false;
      do {
        pPVar2 = this;
        if (local_38 == this) {
LAB_004ce6b2:
          bVar1 = PStruct::ReadFields(&local_38->super_PStruct,ar,addr);
          bVar3 = (bool)(bVar3 | bVar1);
        }
        else {
          do {
            pPVar2 = pPVar2->ParentClass;
            if (pPVar2 == (PClass *)0x0) break;
          } while (pPVar2 != local_38);
          if (pPVar2 != (PClass *)0x0) goto LAB_004ce6b2;
          DPrintf(1,"Unknown superclass %s of class %s\n",
                  FName::NameData.NameArray
                  [(local_38->super_PStruct).super_PNamedType.TypeName.Index].Text,
                  FName::NameData.NameArray[(this->super_PStruct).super_PNamedType.TypeName.Index].
                  Text);
          PType::SkipValue(ar,0xe);
        }
        FArchive::UserReadClass(ar,&local_38);
      } while (local_38 != (PClass *)0x0);
    }
  }
  else {
    PType::SkipValue(ar,(uint)local_39);
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool PClass::ReadValue(FArchive &ar, void *addr) const
{
	BYTE tag;
	ar << tag;
	if (tag != VAL_Class)
	{
		SkipValue(ar, tag);
		return false;
	}
	else
	{
		bool readsomething = false;
		PClass *type;
		for (ar.UserReadClass(type); type != NULL; ar.UserReadClass(type))
		{
			// Only read it if the type is related to this one.
			const PClass *parent;
			for (parent = this; parent != NULL; parent = parent->ParentClass)
			{
				if (parent == type)
				{
					break;
				}
			}
			if (parent != NULL)
			{
				readsomething |= type->ReadFields(ar, addr);
			}
			else
			{
				DPrintf(DMSG_ERROR, "Unknown superclass %s of class %s\n",
					type->TypeName.GetChars(), TypeName.GetChars());
				SkipValue(ar, VAL_Struct);
			}
		}
		return readsomething;
	}
}